

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O1

void __thiscall DataFileTest::testWrite(DataFileTest *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  DataFileWriter<Complex<long>_> df;
  auto_ptr<avro::DataFileWriterBase> local_20;
  
  avro::DataFileWriter<Complex<long>_>::DataFileWriter
            ((DataFileWriter<Complex<long>_> *)&local_20,this->filename,&this->writerSchema,100,
             NULL_CODEC);
  lVar2 = 3;
  lVar3 = 5;
  do {
    avro::DataFileWriterBase::syncIfNeeded();
    plVar1 = *(long **)(local_20._M_ptr + 0x30);
    (**(code **)(*plVar1 + 0x38))(plVar1,lVar2);
    (**(code **)(*plVar1 + 0x38))(plVar1,lVar3);
    *(long *)(local_20._M_ptr + 0x70) = *(long *)(local_20._M_ptr + 0x70) + 1;
    lVar2 = lVar2 * lVar3;
    lVar3 = lVar3 + 3;
  } while ((int)lVar3 != 0xbbd);
  avro::DataFileWriterBase::close();
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&local_20);
  return;
}

Assistant:

void testWrite() {
        avro::DataFileWriter<ComplexInteger> df(filename, writerSchema, 100);
        int64_t re = 3;
        int64_t im = 5;
        for (int i = 0; i < count; ++i, re *= im, im += 3) {
            ComplexInteger c(re, im);
            df.write(c);
        }
        df.close();
    }